

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O3

void STAT_Serialize(FSerializer *arc)

{
  uint amount;
  FString __s2;
  FEpisode *pFVar1;
  bool bVar2;
  int iVar3;
  FEpisode *pFVar4;
  ulong uVar5;
  FString startlevel;
  FString local_30;
  
  amount = LevelData.Count;
  local_30.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  bVar2 = FSerializer::BeginObject(arc,"statistics");
  if (bVar2) {
    if (arc->r == (FReader *)0x0) {
      if (StartEpisode != (FEpisode *)0x0) {
        FString::operator=(&local_30,&StartEpisode->mEpisodeMap);
      }
      Serialize(arc,"startlevel",&local_30,(FString *)0x0);
    }
    else {
      Serialize(arc,"startlevel",&local_30,(FString *)0x0);
      __s2.Chars = local_30.Chars;
      StartEpisode = (FEpisode *)0x0;
      uVar5 = (ulong)AllEpisodes.Count;
      pFVar4 = AllEpisodes.Array;
      while ((pFVar1 = StartEpisode, uVar5 != 0 &&
             (iVar3 = strcasecmp((pFVar4->mEpisodeMap).Chars,__s2.Chars), pFVar1 = pFVar4,
             iVar3 != 0))) {
        pFVar4 = pFVar4 + 1;
        uVar5 = uVar5 - 1;
      }
      StartEpisode = pFVar1;
      TArray<OneLevel,_OneLevel>::Resize(&LevelData,amount);
    }
    Serialize<OneLevel,OneLevel>(arc,"levels",&LevelData,(TArray<OneLevel,_OneLevel> *)0x0);
    FSerializer::EndObject(arc);
  }
  FString::~FString(&local_30);
  return;
}

Assistant:

void STAT_Serialize(FSerializer &arc)
{
	FString startlevel;
	int i = LevelData.Size();

	if (arc.BeginObject("statistics"))
	{
		if (arc.isReading())
		{
			arc("startlevel", startlevel);
			StartEpisode = NULL;
			for (unsigned int j = 0; j < AllEpisodes.Size(); j++)
			{
				if (!AllEpisodes[j].mEpisodeMap.CompareNoCase(startlevel))
				{
					StartEpisode = &AllEpisodes[j];
					break;
				}
			}
			LevelData.Resize(i);
		}
		else
		{
			if (StartEpisode != NULL) startlevel = StartEpisode->mEpisodeMap;
			arc("startlevel", startlevel);
		}
		arc("levels", LevelData);
		arc.EndObject();
	}
}